

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool set_location_window_from_val
               (Am_Object *locgen_window,Am_Inter_Location *current_val,Am_Value *old_val)

{
  bool value;
  ostream *poVar1;
  am_loc_values *value_00;
  Am_Wrapper *value_01;
  Am_Slot_Key key;
  bool as_line;
  int d;
  int c;
  int b;
  int a;
  Am_Object ref_obj;
  ostrstream oss;
  char line [250];
  
  ref_obj.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location(current_val,&as_line,&ref_obj,&a,&b,&c,&d);
  value = Am_Inter_Location::Get_Growing(current_val);
  if (as_line == true) {
    std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
    poVar1 = std::operator<<((ostream *)&oss,"Not yet implemented to generalize when as a line");
    std::ends<char,std::char_traits<char>>(poVar1);
    Am_Pop_Up_Error_Window(line);
    std::ostrstream::~ostrstream(&oss);
  }
  else {
    value_00 = create_loc_values(current_val,old_val);
    Am_Object::Set(locgen_window,0xfa,value_00,0);
    key = (Am_Slot_Key)locgen_window;
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_CHANGE_LEFT);
    Am_Object::Set((Am_Object *)&oss,0x169,true,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_LEFT_HOW);
    Am_Object::Set((Am_Object *)&oss,0x169,10,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_LEFT_AMOUNT_WIDGET);
    Am_Object::Set((Am_Object *)&oss,0x169,a,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_CHANGE_TOP);
    Am_Object::Set((Am_Object *)&oss,0x169,true,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_TOP_HOW);
    Am_Object::Set((Am_Object *)&oss,0x169,10,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_TOP_AMOUNT_WIDGET);
    Am_Object::Set((Am_Object *)&oss,0x169,b,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_CHANGE_WIDTH);
    Am_Object::Set((Am_Object *)&oss,0xcc,value,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_CHANGE_WIDTH);
    Am_Object::Set((Am_Object *)&oss,0x169,value,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_WIDTH_HOW);
    Am_Object::Set((Am_Object *)&oss,0x169,10,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_WIDTH_AMOUNT_WIDGET);
    Am_Object::Set((Am_Object *)&oss,0x169,c,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_CHANGE_HEIGHT);
    Am_Object::Set((Am_Object *)&oss,0xcc,value,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_CHANGE_HEIGHT);
    Am_Object::Set((Am_Object *)&oss,0x169,value,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_HEIGHT_HOW);
    Am_Object::Set((Am_Object *)&oss,0x169,10,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_HEIGHT_AMOUNT_WIDGET);
    Am_Object::Set((Am_Object *)&oss,0x169,d,0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    Am_Object::Get_Object((Am_Object *)&oss,key,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
    Am_Object::Set((Am_Object *)&oss,0x169,"",0);
    Am_Object::~Am_Object((Am_Object *)&oss);
    value_01 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(current_val);
    Am_Object::Set(locgen_window,0x169,value_01,0);
  }
  Am_Object::~Am_Object(&ref_obj);
  return (bool)(as_line ^ 1);
}

Assistant:

bool
set_location_window_from_val(Am_Object &locgen_window,
                             Am_Inter_Location &current_val, Am_Value &old_val)
{
  bool as_line;
  int a, b, c, d;
  Am_Object ref_obj;
  current_val.Get_Location(as_line, ref_obj, a, b, c, d);
  bool growing = current_val.Get_Growing();
  if (as_line) {
    AM_POP_UP_ERROR_WINDOW("Not yet implemented to generalize when as a line");
    return false;
  }

  am_loc_values *loc_values = create_loc_values(current_val, old_val);
  locgen_window.Set(Am_VALUES, (Am_Ptr)loc_values);

  locgen_window.Get_Object(Am_CHANGE_LEFT).Set(Am_VALUE, true);
  locgen_window.Get_Object(Am_LEFT_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_LEFT_AMOUNT_WIDGET).Set(Am_VALUE, a);

  locgen_window.Get_Object(Am_CHANGE_TOP).Set(Am_VALUE, true);
  locgen_window.Get_Object(Am_TOP_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_TOP_AMOUNT_WIDGET).Set(Am_VALUE, b);

  locgen_window.Get_Object(Am_CHANGE_WIDTH).Set(Am_ACTIVE, growing);
  locgen_window.Get_Object(Am_CHANGE_WIDTH).Set(Am_VALUE, growing);
  locgen_window.Get_Object(Am_WIDTH_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_WIDTH_AMOUNT_WIDGET).Set(Am_VALUE, c);

  locgen_window.Get_Object(Am_CHANGE_HEIGHT).Set(Am_ACTIVE, growing);
  locgen_window.Get_Object(Am_CHANGE_HEIGHT).Set(Am_VALUE, growing);
  locgen_window.Get_Object(Am_HEIGHT_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_HEIGHT_AMOUNT_WIDGET).Set(Am_VALUE, d);

  locgen_window.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Set(Am_VALUE, "");

  locgen_window.Set(Am_VALUE, current_val);

  return true;
}